

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O1

bool __thiscall ON_PolyCurve::IsValid(ON_PolyCurve *this,bool bAllowGaps,ON_TextLog *text_log)

{
  uint uVar1;
  ON_Curve *pOVar2;
  double *pdVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  byte local_66;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  
  uVar7 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  uVar11 = (ulong)uVar7;
  uVar5 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])();
  if ((int)uVar7 < 1 || (int)uVar5 < 1) {
    if (text_log == (ON_TextLog *)0x0) goto LAB_0058e474;
    pcVar9 = "Polycurve segment count = %d and dim = %d\n";
    uVar1 = uVar5;
  }
  else {
    uVar1 = (this->m_t).m_count;
    if (uVar1 == uVar7 + 1) {
      if (0 < (int)uVar7) {
        uVar10 = 0;
        do {
          pOVar2 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar10];
          if (pOVar2 == (ON_Curve *)0x0) {
            if (text_log != (ON_TextLog *)0x0) {
              pcVar9 = "Polycurve segment[%d] is null.\n";
LAB_0058e4dd:
              ON_TextLog::Print(text_log,pcVar9,uVar10 & 0xffffffff);
            }
            goto LAB_0058e474;
          }
          iVar6 = (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])();
          if ((char)iVar6 == '\0') {
            if (text_log != (ON_TextLog *)0x0) {
              pcVar9 = "Polycurve segment[%d] is not valid.\n";
              goto LAB_0058e4dd;
            }
            goto LAB_0058e474;
          }
          uVar7 = (*((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar10]->
                    super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])();
          if (uVar7 == uVar5) {
            pdVar3 = (this->m_t).m_a;
            if (pdVar3[uVar10 + 1] <= pdVar3[uVar10]) {
              if (text_log != (ON_TextLog *)0x0) {
                ON_TextLog::Print(text_log,
                                  "Polycurve m_t[%d]=%g and m_t[%d]=%g (should be increasing)\n",
                                  uVar10 & 0xffffffff,uVar10 + 1);
              }
              goto LAB_0058e439;
            }
            bVar4 = true;
            if ((uVar11 != 1 && !bAllowGaps) &&
               (iVar6 = (*((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar10]->
                          super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])(),
               (char)iVar6 != '\0')) {
              if (text_log != (ON_TextLog *)0x0) {
                ON_TextLog::Print(text_log,"Polycurve segment[%d] is closed (%d segments).\n",
                                  uVar10 & 0xffffffff,uVar11);
              }
              goto LAB_0058e439;
            }
          }
          else {
            if (text_log != (ON_TextLog *)0x0) {
              ON_TextLog::Print(text_log,"Polycurve segment[%d]->Dimension()=%d (should be %d).\n",
                                uVar10 & 0xffffffff,(ulong)uVar7,(ulong)uVar5);
            }
LAB_0058e439:
            bVar4 = false;
            local_66 = ON_IsNotValid();
          }
          if (!bVar4) goto LAB_0058e561;
          uVar10 = uVar10 + 1;
        } while (uVar11 != uVar10);
      }
      if (!bAllowGaps) {
        iVar6 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
        iVar8 = 1;
        if (1 < iVar6) {
          iVar8 = iVar6;
        }
        uVar7 = 0;
        do {
          if (iVar8 - 1U == uVar7) {
            uVar5 = 0;
            break;
          }
          uVar5 = uVar7 + 1;
          bVar4 = HasGapAt(this,uVar7);
          uVar7 = uVar5;
        } while (!bVar4);
        if (uVar5 != 0) {
          ON_Curve::PointAtEnd
                    (&local_48,
                     (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[(long)(int)uVar5 + -1]);
          ON_Curve::PointAtStart
                    (&local_60,(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[(int)uVar5]);
          ON_3dPoint::DistanceTo(&local_48,&local_60);
          if (text_log != (ON_TextLog *)0x0) {
            ON_TextLog::Print(text_log,
                              "Polycurve end of segment[%d] != start of segment[%d] (distance=%g)\n"
                              ,(ulong)(uVar5 - 1),(ulong)uVar5);
          }
          local_66 = ON_IsNotValid();
        }
        if (uVar5 != 0) goto LAB_0058e561;
      }
      local_66 = 1;
LAB_0058e561:
      return (bool)(local_66 & 1);
    }
    if (text_log == (ON_TextLog *)0x0) goto LAB_0058e474;
    pcVar9 = "Polycurve segment count = %d and m_t.Count()=%d (should be segment count+1)\n";
  }
  ON_TextLog::Print(text_log,pcVar9,uVar11,(ulong)uVar1);
LAB_0058e474:
  bVar4 = ON_IsNotValid();
  return bVar4;
}

Assistant:

bool ON_PolyCurve::IsValid( bool bAllowGaps, ON_TextLog* text_log ) const
{
  const int count = Count();
  const int dim = Dimension();
  ON_3dPoint p0, p1;
  int segment_index;
  if ( count <= 0 || dim <= 0 )
  {
    if ( text_log )
      text_log->Print("Polycurve segment count = %d and dim = %d\n",count,dim);
    return ON_IsNotValid();
  }

  if ( m_t.Count() != count+1 )
  {
    if ( text_log )
      text_log->Print("Polycurve segment count = %d and m_t.Count()=%d (should be segment count+1)\n",
                      count,m_t.Count());
    return ON_IsNotValid();
  }

  for ( segment_index = 0; segment_index < count; segment_index++ ) 
  {
    if ( 0 == m_segment[segment_index] )
    {
      if ( text_log )
      {
        text_log->Print("Polycurve segment[%d] is null.\n",segment_index);
      }
      return ON_IsNotValid();
    }

    if ( !m_segment[segment_index]->IsValid( text_log ) )
    {
      if ( text_log )
      {
        text_log->Print("Polycurve segment[%d] is not valid.\n",segment_index);
      }
      return ON_IsNotValid();
    }

    int seg_dim = m_segment[segment_index]->Dimension();
    if ( seg_dim != dim )
    {
      if ( text_log )
        text_log->Print("Polycurve segment[%d]->Dimension()=%d (should be %d).\n",segment_index,seg_dim,dim);
      return ON_IsNotValid(); // all segments must have same dimension
    }

    if ( m_t[segment_index] >= m_t[segment_index+1] )
    {
      if ( text_log )
        text_log->Print("Polycurve m_t[%d]=%g and m_t[%d]=%g (should be increasing)\n",
                         segment_index,   m_t[segment_index],
                         segment_index+1, m_t[segment_index+1]);
      return ON_IsNotValid(); // segment domain must be non-empty
    }

    if ( count > 1 && !bAllowGaps && m_segment[segment_index]->IsClosed() ) 
    {
      if ( text_log )
        text_log->Print("Polycurve segment[%d] is closed (%d segments).\n",segment_index,count);
      return ON_IsNotValid(); // closed segments not permitted in multi segment curve
    }
  }

  if ( !bAllowGaps )
  {
    // check for gaps
    int gap_index = FindNextGap(0);
    if ( gap_index > 0 )
    {
      p0 = m_segment[gap_index-1]->PointAtEnd();
      p1 = m_segment[gap_index]->PointAtStart();
      double d = p0.DistanceTo(p1);
      if ( text_log )
        text_log->Print("Polycurve end of segment[%d] != start of segment[%d] (distance=%g)\n",
                        gap_index-1, gap_index, d );
      return ON_IsNotValid(); // not contiguous
    }
  }

  return true;
}